

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Info.cpp
# Opt level: O0

void PrintHierarchy(aiNode *node,string *indent,bool verbose,bool last,bool first)

{
  aiVector3t<float> *this;
  uint uVar1;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  ulong uStack_110;
  bool lastone;
  size_t i_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 local_c8 [8];
  string nextIndent;
  float local_a0;
  aiVector3D t;
  aiVector3D r;
  aiVector3D s;
  string indentadd;
  ulong uStack_58;
  uint mesh_index;
  size_t i;
  bool sep;
  string local_40 [8];
  string branchchar;
  bool first_local;
  bool last_local;
  bool verbose_local;
  string *indent_local;
  aiNode *node_local;
  
  branchchar.field_2._M_local_buf[0xd] = first;
  branchchar.field_2._M_local_buf[0xe] = last;
  branchchar.field_2._M_local_buf[0xf] = verbose;
  std::__cxx11::string::string(local_40);
  if ((branchchar.field_2._M_local_buf[0xd] & 1U) == 0) {
    if ((branchchar.field_2._M_local_buf[0xe] & 1U) == 0) {
      std::__cxx11::string::operator=(local_40,TREE_BRANCH);
    }
    else {
      std::__cxx11::string::operator=(local_40,TREE_STOP);
    }
  }
  else {
    std::__cxx11::string::operator=(local_40,"");
  }
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)indent);
  poVar3 = std::operator<<(poVar3,local_40);
  pcVar4 = aiString::C_Str(&node->mName);
  std::operator<<(poVar3,pcVar4);
  if (node->mNumMeshes != 0) {
    std::operator<<((ostream *)&std::cout," (mesh ");
    bVar2 = false;
    for (uStack_58 = 0; uStack_58 < node->mNumMeshes; uStack_58 = uStack_58 + 1) {
      uVar1 = node->mMeshes[uStack_58];
      if (bVar2) {
        std::operator<<((ostream *)&std::cout,", ");
      }
      std::ostream::operator<<(&std::cout,uVar1);
      bVar2 = true;
    }
    std::operator<<((ostream *)&std::cout,")");
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  if ((branchchar.field_2._M_local_buf[0xf] & 1U) != 0) {
    std::__cxx11::string::string((string *)&s.y);
    if ((branchchar.field_2._M_local_buf[0xe] & 1U) == 0) {
      std::__cxx11::string::operator+=((string *)&s.y,TREE_CONTINUE);
    }
    else {
      std::__cxx11::string::operator+=((string *)&s.y,"  ");
    }
    if (node->mNumChildren == 0) {
      std::__cxx11::string::operator+=((string *)&s.y,"  ");
    }
    else {
      std::__cxx11::string::operator+=((string *)&s.y,TREE_CONTINUE);
    }
    aiVector3t<float>::aiVector3t((aiVector3t<float> *)&r.y);
    aiVector3t<float>::aiVector3t((aiVector3t<float> *)&t.y);
    this = (aiVector3t<float> *)((long)&nextIndent.field_2 + 0xc);
    aiVector3t<float>::aiVector3t(this);
    aiMatrix4x4t<float>::Decompose
              (&node->mTransformation,(aiVector3t<float> *)&r.y,(aiVector3t<float> *)&t.y,this);
    if (((((r.y != 1.0) || (NAN(r.y))) || (r.z != 1.0)) || ((NAN(r.z) || (s.x != 1.0)))) ||
       (NAN(s.x))) {
      poVar3 = std::operator<<((ostream *)&std::cout,(string *)indent);
      std::operator<<(poVar3,(string *)&s.y);
      printf("  S:[%f %f %f]\n",(double)r.y,(double)r.z,(double)s.x);
    }
    if (((t.y != 0.0) || (NAN(t.y))) ||
       ((t.z != 0.0 || (((NAN(t.z) || (r.x != 0.0)) || (NAN(r.x))))))) {
      poVar3 = std::operator<<((ostream *)&std::cout,(string *)indent);
      std::operator<<(poVar3,(string *)&s.y);
      printf("  R:[%f %f %f]\n",(double)t.y,(double)t.z,(double)r.x);
    }
    if (((((float)nextIndent.field_2._12_4_ != 0.0) || (NAN((float)nextIndent.field_2._12_4_))) ||
        ((local_a0 != 0.0 || ((NAN(local_a0) || (t.x != 0.0)))))) || (NAN(t.x))) {
      poVar3 = std::operator<<((ostream *)&std::cout,(string *)indent);
      std::operator<<(poVar3,(string *)&s.y);
      printf("  T:[%f %f %f]\n",(double)(float)nextIndent.field_2._12_4_,(double)local_a0,
             (double)t.x);
    }
    std::__cxx11::string::~string((string *)&s.y);
  }
  std::__cxx11::string::string((string *)local_c8);
  if ((branchchar.field_2._M_local_buf[0xd] & 1U) == 0) {
    if ((branchchar.field_2._M_local_buf[0xe] & 1U) == 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_1,
                     indent,TREE_CONTINUE);
      std::__cxx11::string::operator=((string *)local_c8,(string *)&i_1);
      std::__cxx11::string::~string((string *)&i_1);
    }
    else {
      std::operator+(&local_e8,indent,"  ");
      std::__cxx11::string::operator=((string *)local_c8,(string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
    }
  }
  else {
    std::__cxx11::string::operator=((string *)local_c8,(string *)indent);
  }
  for (uStack_110 = 0; uStack_110 < node->mNumChildren; uStack_110 = uStack_110 + 1) {
    PrintHierarchy(node->mChildren[uStack_110],(string *)local_c8,
                   (bool)(branchchar.field_2._M_local_buf[0xf] & 1),
                   uStack_110 == node->mNumChildren - 1,false);
  }
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void PrintHierarchy(
	const aiNode* node,
	const std::string &indent,
	bool verbose,
	bool last = false,
	bool first = true
){
	// tree visualization
	std::string branchchar;
	if (first) { branchchar = ""; }
	else if (last) { branchchar = TREE_STOP; } // "'-"
	else { branchchar = TREE_BRANCH; } // "|-"

	// print the indent and the branch character and the name
	std::cout << indent << branchchar << node->mName.C_Str();

	// if there are meshes attached, indicate this
	if (node->mNumMeshes) {
		std::cout << " (mesh ";
		bool sep = false;
		for (size_t i=0; i < node->mNumMeshes; ++i) {
			unsigned int mesh_index = node->mMeshes[i];
			if (sep) { std::cout << ", "; }
			std::cout << mesh_index;
			sep = true;
		}
		std::cout << ")";
	}

	// finish the line
	std::cout << std::endl;

	// in verbose mode, print the transform data as well
	if (verbose) {
		// indent to use
		std::string indentadd;
		if (last) { indentadd += "  "; }
		else { indentadd += TREE_CONTINUE; } // "| "..
		if (node->mNumChildren == 0) { indentadd += "  "; }
		else { indentadd += TREE_CONTINUE; } // .."| "
		aiVector3D s, r, t;
		node->mTransformation.Decompose(s, r, t);
		if (s.x != 1.0 || s.y != 1.0 || s.z != 1.0) {
			std::cout << indent << indentadd;
			printf("  S:[%f %f %f]\n", s.x, s.y, s.z);
		}
		if (r.x || r.y || r.z) {
			std::cout << indent << indentadd;
			printf("  R:[%f %f %f]\n", r.x, r.y, r.z);
		}
		if (t.x || t.y || t.z) {
			std::cout << indent << indentadd;
			printf("  T:[%f %f %f]\n", t.x, t.y, t.z);
		}
	}

	// and recurse
	std::string nextIndent;
	if (first) { nextIndent = indent; }
	else if (last) { nextIndent = indent + "  "; }
	else { nextIndent = indent + TREE_CONTINUE; } // "| "
	for (size_t i = 0; i < node->mNumChildren; ++i) {
		bool lastone = (i == node->mNumChildren - 1);
		PrintHierarchy(
			node->mChildren[i],
			nextIndent,
			verbose,
			lastone,
			false
		);
	}
}